

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

Property soul::heart::ProcessorProperty::getPropertyFromName(string *name)

{
  int iVar1;
  Property PVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    PVar2 = period;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      PVar2 = frequency;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        PVar2 = id;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          PVar2 = session;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          PVar2 = (uint)(iVar1 == 0) * 5;
        }
      }
    }
  }
  return PVar2;
}

Assistant:

static Property getPropertyFromName (const std::string& name)
        {
            if (name == "period")     return Property::period;
            if (name == "frequency")  return Property::frequency;
            if (name == "id")         return Property::id;
            if (name == "session")    return Property::session;
            if (name == "latency")    return Property::latency;

            return Property::none;
        }